

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionEvaluator.cpp
# Opt level: O3

void __thiscall
OpenMD::SelectionEvaluator::instructionDispatchLoop(SelectionEvaluator *this,SelectionSet *bs)

{
  pointer pvVar1;
  pointer pTVar2;
  bool bVar3;
  ulong uVar4;
  fd_set *__writefds;
  ulong uVar5;
  fd_set *extraout_RDX;
  fd_set *extraout_RDX_00;
  fd_set *__readfds;
  fd_set *in_R8;
  timeval *in_R9;
  Token token;
  Token local_50;
  any *local_38;
  
  do {
    uVar4 = (ulong)this->pc;
    pvVar1 = (this->aatoken).
             super__Vector_base<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar5 = ((long)(this->aatoken).
                   super__Vector_base<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1 >> 3) *
            -0x5555555555555555;
    if (uVar5 < uVar4 || uVar5 - uVar4 == 0) {
      return;
    }
    this->pc = this->pc + 1;
    std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>::operator=
              (&this->statement,pvVar1 + uVar4);
    pTVar2 = (this->statement).super__Vector_base<OpenMD::Token,_std::allocator<OpenMD::Token>_>.
             _M_impl.super__Vector_impl_data._M_start;
    this->statementLength =
         (int)((ulong)((long)(this->statement).
                             super__Vector_base<OpenMD::Token,_std::allocator<OpenMD::Token>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (long)pTVar2) >> 3) *
         -0x55555555;
    uVar4._0_4_ = pTVar2->tok;
    uVar4._4_4_ = pTVar2->intValue;
    local_50.value._M_storage._M_ptr = (void *)0x0;
    __writefds = (fd_set *)(pTVar2->value)._M_manager;
    local_50._0_8_ = uVar4;
    if (__writefds == (fd_set *)0x0) {
      local_50.value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
      __readfds = extraout_RDX;
    }
    else {
      local_38 = &local_50.value;
      (*(code *)__writefds)(2,&pTVar2->value,&local_38);
      uVar4 = local_50._0_8_ & 0xffffffff;
      __readfds = extraout_RDX_00;
    }
    if ((int)uVar4 == 0x302) {
      bVar3 = true;
      select(this,(int)bs,__readfds,__writefds,in_R8,in_R9);
    }
    else if ((int)uVar4 == 0x301) {
      bVar3 = true;
      define(this);
    }
    else {
      unrecognizedCommand(this,&local_50);
      bVar3 = false;
    }
    if (local_50.value._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
      (*local_50.value._M_manager)(_Op_destroy,&local_50.value,(_Arg *)0x0);
    }
  } while (bVar3);
  return;
}

Assistant:

void SelectionEvaluator::instructionDispatchLoop(SelectionSet& bs) {
    while (pc < aatoken.size()) {
      statement       = aatoken[pc++];
      statementLength = statement.size();
      Token token     = statement[0];
      switch (token.tok) {
      case Token::define:
        define();
        break;
      case Token::select:
        select(bs);
        break;
      default:
        unrecognizedCommand(token);
        return;
      }
    }
  }